

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O0

int __thiscall SingleFile::GetType(SingleFile *this)

{
  ITypeManager *pIVar1;
  string local_40 [36];
  int local_1c;
  SingleFile *pSStack_18;
  int type;
  SingleFile *this_local;
  
  pIVar1 = (this->super_IContainedElement).type_manager_;
  pSStack_18 = this;
  local_1c = (*pIVar1->_vptr_ITypeManager[1])(pIVar1,this->buffer_,(ulong)(uint)this->buffer_size_);
  this_local._4_4_ = local_1c;
  if (local_1c == 0) {
    pIVar1 = (this->super_IContainedElement).type_manager_;
    std::__cxx11::string::string(local_40,(string *)&this->file_name_);
    this_local._4_4_ = (**pIVar1->_vptr_ITypeManager)(pIVar1,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return this_local._4_4_;
}

Assistant:

int SingleFile::GetType()
{
   // Check from buffer
   int type = type_manager_->GetTypeFromBuffer(buffer_, buffer_size_);
   if (type == 0)
      return type_manager_->GetTypeFromFile(file_name_);
   return type;
}